

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dupprintf.c
# Opt level: O0

char * dupvprintf_inner(char *buf,size_t oldlen,size_t *sizeptr,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  undefined8 uStack_58;
  int len;
  va_list aq;
  size_t local_38;
  size_t size;
  __va_list_tag *ap_local;
  char *fmt_local;
  size_t *sizeptr_local;
  size_t oldlen_local;
  char *buf_local;
  
  local_38 = *sizeptr;
  size = (size_t)ap;
  ap_local = (__va_list_tag *)fmt;
  fmt_local = (char *)sizeptr;
  sizeptr_local = (size_t *)oldlen;
  oldlen_local = (size_t)buf;
  oldlen_local = (size_t)safegrowarray(buf,&local_38,1,oldlen,0x200,true);
  while( true ) {
    aq[0].overflow_arg_area = *(void **)(size + 0x10);
    uStack_58 = *(undefined8 *)size;
    aq[0]._0_8_ = *(undefined8 *)(size + 8);
    iVar1 = vsnprintf((char *)(oldlen_local + (long)sizeptr_local),local_38 - (long)sizeptr_local,
                      (char *)ap_local,&stack0xffffffffffffffa8);
    if ((-1 < iVar1) && ((ulong)(long)iVar1 < local_38)) break;
    if (iVar1 < 1) {
      oldlen_local = (size_t)safegrowarray((void *)oldlen_local,&local_38,1,local_38,1,true);
    }
    else {
      oldlen_local = (size_t)safegrowarray((void *)oldlen_local,&local_38,1,(long)sizeptr_local + 1,
                                           (long)iVar1,true);
    }
  }
  *(size_t *)fmt_local = local_38;
  return (char *)oldlen_local;
}

Assistant:

char *dupvprintf_inner(char *buf, size_t oldlen, size_t *sizeptr,
                       const char *fmt, va_list ap)
{
    size_t size = *sizeptr;
    sgrowarrayn_nm(buf, size, oldlen, 512);

    while (1) {
        va_list aq;
        va_copy(aq, ap);
        int len = vsnprintf(buf + oldlen, size - oldlen, fmt, aq);
        va_end(aq);

        if (len >= 0 && len < size) {
            /* This is the C99-specified criterion for snprintf to have
             * been completely successful. */
            *sizeptr = size;
            return buf;
        } else if (len > 0) {
            /* This is the C99 error condition: the returned length is
             * the required buffer size not counting the NUL. */
            sgrowarrayn_nm(buf, size, oldlen + 1, len);
        } else {
            /* This is the pre-C99 glibc error condition: <0 means the
             * buffer wasn't big enough, so we enlarge it a bit and hope. */
            sgrowarray_nm(buf, size, size);
        }
    }
}